

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O1

FT_Error tt_cmap14_validate(FT_Byte *table,FT_Validator valid)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  ushort uVar8;
  uint uVar9;
  byte *pbVar11;
  uint uVar12;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  FT_Byte *pFVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar10;
  ulong uVar13;
  
  pbVar11 = table + 10;
  if (valid->limit < pbVar11) {
    ft_validator_error(valid,8);
  }
  uVar12 = *(uint *)(table + 2);
  uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
  uVar13 = (ulong)uVar12;
  bVar1 = table[6];
  bVar2 = table[7];
  bVar3 = table[8];
  bVar4 = table[9];
  uVar18 = (ulong)bVar2 * 0x10000 + (ulong)bVar1 * 0x1000000 | (ulong)bVar3 << 8 | (ulong)bVar4;
  if (((uVar12 < 10) || ((ulong)((long)valid->limit - (long)table) < uVar13)) ||
     ((uVar13 - 10) / 0xb < uVar18)) {
    ft_validator_error(valid,8);
  }
  if (uVar18 != 0) {
    uVar20 = 1;
    uVar18 = 0;
    do {
      bVar5 = *pbVar11;
      bVar6 = pbVar11[1];
      bVar7 = pbVar11[2];
      uVar9 = *(uint *)(pbVar11 + 3);
      uVar14 = *(uint *)(pbVar11 + 7);
      uVar15 = (ulong)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                      uVar9 << 0x18);
      uVar9 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
      uVar10 = (ulong)uVar9;
      if ((uVar13 <= uVar15) || (uVar12 <= uVar9)) {
        ft_validator_error(valid,8);
      }
      uVar9 = (uint)bVar7 | (uint)bVar6 << 8 | (uint)bVar5 << 0x10;
      if (uVar9 < uVar20) {
        ft_validator_error(valid,8);
      }
      if (uVar15 != 0) {
        pFVar19 = table + uVar15 + 4;
        if (valid->limit < pFVar19) {
          ft_validator_error(valid,8);
        }
        uVar20 = *(uint *)(table + uVar15);
        uVar22 = (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                        uVar20 << 0x18);
        if ((ulong)((long)valid->limit - (long)pFVar19) >> 2 < uVar22) {
          ft_validator_error(valid,8);
        }
        if (uVar22 != 0) {
          uVar21 = 0;
          uVar20 = 0;
          do {
            uVar16 = (uint)table[uVar21 * 4 + uVar15 + 6] |
                     (uint)table[uVar21 * 4 + uVar15 + 5] << 8 | (uint)pFVar19[uVar21 * 4] << 0x10;
            uVar14 = table[uVar21 * 4 + uVar15 + 7] + uVar16;
            if (0x10ffff < uVar14) {
              ft_validator_error(valid,8);
            }
            if (uVar16 < uVar20) {
              ft_validator_error(valid,8);
            }
            uVar20 = uVar14 + 1;
            uVar21 = uVar21 + 1;
          } while (uVar22 != uVar21);
        }
      }
      if (uVar10 != 0) {
        pFVar19 = table + uVar10 + 4;
        if (valid->limit < pFVar19) {
          ft_validator_error(valid,8);
        }
        uVar20 = *(uint *)(table + uVar10);
        uVar15 = (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                        uVar20 << 0x18);
        if ((ulong)((long)valid->limit - (long)pFVar19) / 5 < uVar15) {
          ft_validator_error(valid,8);
        }
        if (uVar15 != 0) {
          lVar17 = 0;
          uVar22 = 0;
          do {
            bVar5 = pFVar19[lVar17];
            bVar6 = table[lVar17 + uVar10 + 5];
            bVar7 = table[lVar17 + uVar10 + 6];
            uVar8 = *(ushort *)(table + lVar17 + uVar10 + 7);
            if (0x10 < bVar5) {
              ft_validator_error(valid,8);
            }
            uVar21 = (ulong)bVar7 | (ulong)bVar5 << 0x10 | (ulong)bVar6 << 8;
            if (uVar21 < uVar22) {
              ft_validator_error(valid,8);
            }
            if ((valid->level != FT_VALIDATE_DEFAULT) &&
               ((uint)valid[1].jump_buffer[0].__jmpbuf[0] <= (uint)(ushort)(uVar8 << 8 | uVar8 >> 8)
               )) {
              ft_validator_error(valid,0x10);
            }
            uVar22 = uVar21 + 1;
            lVar17 = lVar17 + 5;
          } while (uVar15 * 5 != lVar17);
        }
      }
      pbVar11 = pbVar11 + 0xb;
      uVar20 = uVar9 + 1;
      uVar18 = uVar18 + 1;
    } while (uVar18 != ((ulong)CONCAT11(bVar3,bVar4) |
                       (ulong)bVar1 * 0x1000000 | (ulong)bVar2 * 0x10000));
  }
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  tt_cmap14_validate( FT_Byte*      table,
                      FT_Validator  valid )
  {
    FT_Byte*  p;
    FT_ULong  length;
    FT_ULong  num_selectors;


    if ( table + 2 + 4 + 4 > valid->limit )
      FT_INVALID_TOO_SHORT;

    p             = table + 2;
    length        = TT_NEXT_ULONG( p );
    num_selectors = TT_NEXT_ULONG( p );

    if ( length > (FT_ULong)( valid->limit - table ) ||
         /* length < 10 + 11 * num_selectors ? */
         length < 10                                 ||
         ( length - 10 ) / 11 < num_selectors        )
      FT_INVALID_TOO_SHORT;

    /* check selectors, they must be in increasing order */
    {
      /* we start lastVarSel at 1 because a variant selector value of 0
       * isn't valid.
       */
      FT_ULong  n, lastVarSel = 1;


      for ( n = 0; n < num_selectors; n++ )
      {
        FT_ULong  varSel    = TT_NEXT_UINT24( p );
        FT_ULong  defOff    = TT_NEXT_ULONG( p );
        FT_ULong  nondefOff = TT_NEXT_ULONG( p );


        if ( defOff >= length || nondefOff >= length )
          FT_INVALID_TOO_SHORT;

        if ( varSel < lastVarSel )
          FT_INVALID_DATA;

        lastVarSel = varSel + 1;

        /* check the default table (these glyphs should be reached     */
        /* through the normal Unicode cmap, no GIDs, just check order) */
        if ( defOff != 0 )
        {
          FT_Byte*  defp     = table + defOff;
          FT_ULong  numRanges;
          FT_ULong  i;
          FT_ULong  lastBase = 0;


          if ( defp + 4 > valid->limit )
            FT_INVALID_TOO_SHORT;

          numRanges = TT_NEXT_ULONG( defp );

          /* defp + numRanges * 4 > valid->limit ? */
          if ( numRanges > (FT_ULong)( valid->limit - defp ) / 4 )
            FT_INVALID_TOO_SHORT;

          for ( i = 0; i < numRanges; i++ )
          {
            FT_ULong  base = TT_NEXT_UINT24( defp );
            FT_ULong  cnt  = FT_NEXT_BYTE( defp );


            if ( base + cnt >= 0x110000UL )              /* end of Unicode */
              FT_INVALID_DATA;

            if ( base < lastBase )
              FT_INVALID_DATA;

            lastBase = base + cnt + 1U;
          }
        }

        /* and the non-default table (these glyphs are specified here) */
        if ( nondefOff != 0 )
        {
          FT_Byte*  ndp        = table + nondefOff;
          FT_ULong  numMappings;
          FT_ULong  i, lastUni = 0;


          if ( ndp + 4 > valid->limit )
            FT_INVALID_TOO_SHORT;

          numMappings = TT_NEXT_ULONG( ndp );

          /* numMappings * 5 > (FT_ULong)( valid->limit - ndp ) ? */
          if ( numMappings > ( (FT_ULong)( valid->limit - ndp ) ) / 5 )
            FT_INVALID_TOO_SHORT;

          for ( i = 0; i < numMappings; i++ )
          {
            FT_ULong  uni = TT_NEXT_UINT24( ndp );
            FT_ULong  gid = TT_NEXT_USHORT( ndp );


            if ( uni >= 0x110000UL )                     /* end of Unicode */
              FT_INVALID_DATA;

            if ( uni < lastUni )
              FT_INVALID_DATA;

            lastUni = uni + 1U;

            if ( valid->level >= FT_VALIDATE_TIGHT    &&
                 gid >= TT_VALID_GLYPH_COUNT( valid ) )
              FT_INVALID_GLYPH_ID;
          }
        }
      }
    }

    return FT_Err_Ok;
  }